

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  ulong uVar18;
  uint5 uVar19;
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t *puVar28;
  uint8_t uVar29;
  long lVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  int B;
  long lVar35;
  uint8_t uVar36;
  uint uVar37;
  uint uVar38;
  int X;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  int L;
  
  uVar42 = *(uint *)top;
  auVar14[0xc] = (char)(uVar42 >> 0x18);
  auVar14._0_12_ = ZEXT712(0);
  uVar19 = CONCAT32(auVar14._10_3_,(ushort)(byte)(uVar42 >> 0x10));
  auVar21._5_8_ = 0;
  auVar21._0_5_ = uVar19;
  uVar13 = *(undefined4 *)(top + -5);
  uVar18 = (ulong)(ushort)uVar13 & 0xffffffffffff00ff;
  auVar15._8_4_ = 0;
  auVar15._0_8_ = uVar18;
  auVar15[0xc] = (char)((uint)uVar13 >> 0x18);
  auVar16[8] = (char)((uint)uVar13 >> 0x10);
  auVar16._0_8_ = uVar18;
  auVar16[9] = 0;
  auVar16._10_3_ = auVar15._10_3_;
  auVar20._5_8_ = 0;
  auVar20._0_5_ = auVar16._8_5_;
  auVar17[4] = (char)((uint)uVar13 >> 8);
  auVar17._0_4_ = (int)uVar18;
  auVar17[5] = 0;
  auVar17._6_7_ = SUB137(auVar20 << 0x40,6);
  lVar30 = 0;
  do {
    *(uint *)(dst + lVar30 + 0x600) =
         ((uint)(uint3)(auVar15._10_3_ >> 0x10) + (uint)(uint3)(auVar14._10_3_ >> 0x10) +
          auVar17._4_4_ + (int)CONCAT72(SUB137(auVar21 << 0x40,6),(ushort)(byte)(uVar42 >> 8)) +
          auVar16._8_4_ + (int)uVar19 + (int)uVar18 + (uVar42 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0x80);
  puVar28 = dst + 0x604;
  bVar1 = top[-1];
  lVar30 = 0;
  do {
    bVar2 = top[-2 - lVar30];
    lVar35 = 0;
    do {
      puVar28[lVar35] = clip1[(ulong)top[lVar35] + (ulong)bVar2 + (0xff - (ulong)bVar1)];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 4);
    puVar28 = puVar28 + 0x20;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 4);
  bVar2 = *top;
  bVar3 = top[1];
  bVar4 = top[2];
  bVar5 = top[3];
  bVar6 = top[4];
  lVar30 = 0;
  do {
    dst[lVar30 + 0x608] = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
    uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2);
    dst[lVar30 + 0x609] = uVar27;
    uVar26 = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
    dst[lVar30 + 0x60a] = uVar26;
    uVar29 = (uint8_t)((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2);
    dst[lVar30 + 0x60b] = uVar29;
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0x80);
  bVar7 = top[-2];
  bVar8 = top[-3];
  *(uint *)(dst + 0x60c) = ((uint)bVar8 + (uint)bVar1 + (uint)bVar7 * 2 + 2 >> 2 & 0xff) * 0x1010101
  ;
  bVar9 = top[-4];
  uVar37 = (uint)bVar7 + (uint)bVar8 * 2 + (uint)bVar9 + 2 >> 2;
  *(uint *)(dst + 0x62c) = (uVar37 & 0xff) * 0x1010101;
  bVar10 = top[-5];
  uVar42 = (uint)bVar8 + (uint)bVar10 + (uint)bVar9 * 2 + 2 >> 2;
  *(uint *)(dst + 0x64c) = (uVar42 & 0xff) * 0x1010101;
  uVar38 = (uint)bVar10 + (uint)bVar9 + 2 + (uint)bVar10 * 2 >> 2;
  *(uint *)(dst + 0x66c) = (uVar38 & 0xff) * 0x1010101;
  uVar40 = (uint8_t)uVar42;
  dst[0x670] = uVar40;
  uVar22 = (uint8_t)((uint)bVar7 + (uint)bVar8 * 2 + 2 + (uint)bVar9 >> 2);
  dst[0x671] = uVar22;
  dst[0x650] = uVar22;
  uVar22 = (uint8_t)((uint)bVar1 + (uint)bVar7 * 2 + 2 + (uint)bVar8 >> 2);
  dst[0x672] = uVar22;
  dst[0x651] = uVar22;
  dst[0x630] = uVar22;
  uVar22 = (uint8_t)((uint)bVar2 + (uint)bVar1 * 2 + (uint)bVar7 + 2 >> 2);
  dst[0x673] = uVar22;
  dst[0x652] = uVar22;
  dst[0x631] = uVar22;
  dst[0x610] = uVar22;
  uVar23 = (uint8_t)((uint)bVar1 + (uint)bVar3 + 2 + (uint)bVar2 + (uint)bVar2 >> 2);
  dst[0x653] = uVar23;
  dst[0x632] = uVar23;
  dst[0x611] = uVar23;
  uVar23 = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 + (uint)bVar3 >> 2);
  dst[0x633] = uVar23;
  dst[0x612] = uVar23;
  dst[0x613] = (uint8_t)(bVar3 + 2 + (uint)bVar5 + (uint)bVar4 + (uint)bVar4 >> 2);
  uVar42 = (uint)bVar2;
  uVar23 = (uint8_t)(uVar42 + bVar1 + 1 >> 1);
  dst[0x655] = uVar23;
  dst[0x614] = uVar23;
  uVar23 = (uint8_t)(bVar3 + uVar42 + 1 >> 1);
  dst[0x656] = uVar23;
  dst[0x615] = uVar23;
  uVar36 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x657] = uVar36;
  dst[0x616] = uVar36;
  uVar32 = (uint8_t)((uint)bVar5 + (uint)bVar4 + 1 >> 1);
  dst[0x617] = uVar32;
  uVar24 = (uint8_t)((uint)bVar9 + (uint)bVar7 + 2 + (uint)bVar8 * 2 >> 2);
  dst[0x674] = uVar24;
  uVar25 = (uint8_t)((uint)bVar1 + (uint)bVar8 + 2 + (uint)bVar7 * 2 >> 2);
  dst[0x654] = uVar25;
  dst[0x675] = uVar22;
  dst[0x634] = uVar22;
  uVar31 = (uint8_t)((uint)bVar2 + (uint)bVar2 + (uint)bVar1 + 2 + (uint)bVar3 >> 2);
  dst[0x676] = uVar31;
  dst[0x635] = uVar31;
  uVar41 = (uint8_t)((uint)bVar3 + (uint)bVar3 + uVar42 + 2 + (uint)bVar4 >> 2);
  dst[0x677] = uVar41;
  dst[0x636] = uVar41;
  dst[0x637] = uVar26;
  bVar2 = top[5];
  bVar11 = top[6];
  bVar12 = top[7];
  dst[0x618] = uVar27;
  uVar26 = (uint8_t)((uint)bVar4 + (uint)bVar4 + (uint)bVar3 + (uint)bVar5 + 2 >> 2);
  dst[0x638] = uVar26;
  dst[0x619] = uVar26;
  dst[0x658] = uVar29;
  dst[0x639] = uVar29;
  dst[0x61a] = uVar29;
  uVar33 = (uint8_t)((uint)bVar5 + (uint)bVar6 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x678] = uVar33;
  dst[0x659] = uVar33;
  dst[0x63a] = uVar33;
  dst[0x61b] = uVar33;
  uVar34 = (uint8_t)((uint)bVar6 + (uint)bVar2 * 2 + (uint)bVar11 + 2 >> 2);
  dst[0x679] = uVar34;
  dst[0x65a] = uVar34;
  dst[0x63b] = uVar34;
  uVar39 = (uint8_t)(bVar12 + 2 + (uint)bVar2 + (uint)bVar11 * 2 >> 2);
  dst[0x67a] = uVar39;
  dst[0x65b] = uVar39;
  dst[0x67b] = (uint8_t)((uint)bVar12 * 3 + 2 + (uint)bVar11 >> 2);
  dst[0x61c] = uVar23;
  dst[0x65c] = uVar36;
  dst[0x61d] = uVar36;
  dst[0x65d] = uVar32;
  dst[0x61e] = uVar32;
  uVar23 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x65e] = uVar23;
  dst[0x61f] = uVar23;
  dst[0x63c] = uVar27;
  dst[0x67c] = uVar26;
  dst[0x63d] = uVar26;
  dst[0x67d] = uVar29;
  dst[0x63e] = uVar29;
  dst[0x67e] = uVar33;
  dst[0x63f] = uVar33;
  dst[0x65f] = uVar34;
  dst[0x67f] = uVar39;
  uVar27 = (uint8_t)((uint)bVar7 + (uint)bVar1 + 1 >> 1);
  dst[0x6a2] = uVar27;
  dst[0x680] = uVar27;
  uVar27 = (uint8_t)((uint)bVar8 + (uint)bVar7 + 1 >> 1);
  dst[0x6c2] = uVar27;
  dst[0x6a0] = uVar27;
  uVar29 = (uint8_t)((uint)bVar8 + (uint)bVar9 + 1 >> 1);
  dst[0x6e2] = uVar29;
  dst[0x6c0] = uVar29;
  uVar26 = (uint8_t)((uint)bVar9 + (uint)bVar10 + 1 >> 1);
  dst[0x6e0] = uVar26;
  dst[0x683] = uVar41;
  dst[0x682] = uVar31;
  dst[0x6a3] = uVar22;
  dst[0x681] = uVar22;
  dst[0x6c3] = uVar25;
  dst[0x6a1] = uVar25;
  dst[0x6e3] = uVar24;
  dst[0x6c1] = uVar24;
  dst[0x6e1] = uVar40;
  dst[0x684] = uVar27;
  dst[0x6a4] = uVar29;
  dst[0x686] = uVar29;
  dst[0x6c4] = uVar26;
  dst[0x6a6] = uVar26;
  dst[0x685] = (uint8_t)uVar37;
  dst[0x6a5] = uVar40;
  dst[0x687] = uVar40;
  uVar27 = (uint8_t)uVar38;
  dst[0x6c5] = uVar27;
  dst[0x6a7] = uVar27;
  auVar43 = pshuflw(ZEXT216(CONCAT11(bVar10,bVar10)),ZEXT216(CONCAT11(bVar10,bVar10)),0);
  *(int *)(dst + 0x6e4) = auVar43._0_4_;
  dst[0x6c6] = bVar10;
  dst[0x6c7] = bVar10;
  return;
}

Assistant:

static void Intra4Preds_C(uint8_t* WEBP_RESTRICT dst,
                          const uint8_t* WEBP_RESTRICT top) {
  DC4(I4DC4 + dst, top);
  TM4(I4TM4 + dst, top);
  VE4(I4VE4 + dst, top);
  HE4(I4HE4 + dst, top);
  RD4(I4RD4 + dst, top);
  VR4(I4VR4 + dst, top);
  LD4(I4LD4 + dst, top);
  VL4(I4VL4 + dst, top);
  HD4(I4HD4 + dst, top);
  HU4(I4HU4 + dst, top);
}